

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall cmComputeTargetDepends::CollectSideEffects(cmComputeTargetDepends *this)

{
  size_type __new_size;
  ulong local_50;
  size_t i;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> visited;
  size_t n;
  cmComputeTargetDepends *this_local;
  
  std::
  vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
  ::resize(&this->SideEffects,0);
  __new_size = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                         (&(this->InitialGraph).
                           super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::
  vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
  ::resize(&this->SideEffects,__new_size);
  visited._M_t._M_impl.super__Rb_tree_header._M_node_count =
       std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                 (&(this->InitialGraph).
                   super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&i);
  for (local_50 = 0; local_50 < visited._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_50 = local_50 + 1) {
    CollectSideEffectsForTarget
              (this,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    &i,local_50);
  }
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&i);
  return;
}

Assistant:

void cmComputeTargetDepends::CollectSideEffects()
{
  this->SideEffects.resize(0);
  this->SideEffects.resize(this->InitialGraph.size());

  size_t n = this->InitialGraph.size();
  std::set<size_t> visited;
  for (size_t i = 0; i < n; ++i) {
    this->CollectSideEffectsForTarget(visited, i);
  }
}